

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

bool __thiscall QPDFAcroFormDocumentHelper::hasAcroForm(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  QPDFObjectHandle local_20;
  QPDFAcroFormDocumentHelper *local_10;
  QPDFAcroFormDocumentHelper *this_local;
  
  local_10 = this;
  QPDF::getRoot((QPDF *)&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/AcroForm",&local_41);
  bVar1 = QPDFObjectHandle::hasKey(&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  QPDFObjectHandle::~QPDFObjectHandle(&local_20);
  return bVar1;
}

Assistant:

bool
QPDFAcroFormDocumentHelper::hasAcroForm()
{
    return qpdf.getRoot().hasKey("/AcroForm");
}